

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testCenter<float>(char *type)

{
  ostream *poVar1;
  char *in_RDI;
  float fVar2;
  float fVar3;
  Interval<float> b_1;
  float max;
  float min;
  Interval<float> b1;
  float p1;
  float p0;
  Interval<float> b0;
  Interval<float> b;
  Interval<float> local_40;
  float local_38;
  float local_34;
  Interval<float> local_30;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Interval<float> local_18;
  Interval<float> local_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16ead2);
  fVar2 = Imath_3_2::Interval<float>::center(&local_10);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("b.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x204,"void (anonymous namespace)::testCenter(const char *) [T = float]");
  }
  local_1c = -1.0;
  local_20 = 1.0;
  Imath_3_2::Interval<float>::Interval(&local_18,&local_1c,&local_20);
  fVar2 = Imath_3_2::Interval<float>::center(&local_18);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("b0.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x20c,"void (anonymous namespace)::testCenter(const char *) [T = float]");
  }
  local_24 = 1.0;
  local_28 = 2.0;
  Imath_3_2::Interval<float>::Interval(&local_30,&local_24,&local_28);
  fVar2 = Imath_3_2::Interval<float>::center(&local_30);
  fVar3 = (local_28 + local_24) / 2.0;
  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
    __assert_fail("b1.center () == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x212,"void (anonymous namespace)::testCenter(const char *) [T = float]");
  }
  local_34 = 0.0;
  local_38 = 2.0;
  Imath_3_2::Interval<float>::Interval(&local_40,&local_34,&local_38);
  fVar2 = Imath_3_2::Interval<float>::center(&local_40);
  if ((fVar2 == local_38 / 2.0) && (!NAN(fVar2) && !NAN(local_38 / 2.0))) {
    return;
  }
  __assert_fail("b.center () == max / 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x21e,"void (anonymous namespace)::testCenter(const char *) [T = float]");
}

Assistant:

void
testCenter (const char* type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (b.center () == T (0));
    }

    //
    // Center of non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.center () == T (0));

        T p0 (1);
        T p1 (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (b1.center () == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);

        assert (b.center () == max / 2);
    }
}